

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_function_dump(gravity_function_t *f,code_dump_function codef)

{
  char *local_20;
  code_dump_function codef_local;
  gravity_function_t *f_local;
  
  if (f->identifier == (char *)0x0) {
    local_20 = "$anon";
  }
  else {
    local_20 = f->identifier;
  }
  printf("Function: %s\n",local_20);
  printf("Params:%d Locals:%d Temp:%d Upvalues:%d Tag:%d xdata:%p\n",(ulong)f->nparams,
         (ulong)f->nlocals,(ulong)f->ntemps,(ulong)f->nupvalues,(ulong)f->tag,f->xdata);
  if (f->tag == EXEC_TYPE_NATIVE) {
    if ((f->field_9).field_0.cpool.n != 0) {
      printf("======= CONST POOL =======\n");
    }
    gravity_function_array_dump(f,(f->field_9).field_0.cpool);
    if ((f->field_9).field_0.pname.n != 0) {
      printf("======= PARAM NAMES =======\n");
    }
    gravity_function_array_dump(f,(f->field_9).field_0.pname);
    if ((f->field_9).field_0.pvalue.n != 0) {
      printf("======= PARAM VALUES =======\n");
    }
    gravity_function_array_dump(f,(f->field_9).field_0.pvalue);
    printf("======= BYTECODE =======\n");
    if (((f->field_9).field_0.bytecode != (uint32_t *)0x0) && (codef != (code_dump_function)0x0)) {
      (*codef)((f->field_9).field_0.bytecode);
    }
  }
  printf("\n");
  return;
}

Assistant:

void gravity_function_dump (gravity_function_t *f, code_dump_function codef) {
    printf("Function: %s\n", (f->identifier) ? f->identifier : "$anon");
    printf("Params:%d Locals:%d Temp:%d Upvalues:%d Tag:%d xdata:%p\n", f->nparams, f->nlocals, f->ntemps, f->nupvalues, f->tag, f->xdata);

    if (f->tag == EXEC_TYPE_NATIVE) {
        if (marray_size(f->cpool)) printf("======= CONST POOL =======\n");
        gravity_function_array_dump(f, f->cpool);
        
        if (marray_size(f->pname)) printf("======= PARAM NAMES =======\n");
        gravity_function_array_dump(f, f->pname);
        
        if (marray_size(f->pvalue)) printf("======= PARAM VALUES =======\n");
        gravity_function_array_dump(f, f->pvalue);

        printf("======= BYTECODE =======\n");
        if ((f->bytecode) && (codef)) codef(f->bytecode);
    }

    printf("\n");
}